

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3EvalNextRow(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  u8 *pbEof;
  int *pnList;
  char *pcVar1;
  u8 uVar2;
  Fts3Expr *pFVar3;
  Fts3Expr *pFVar4;
  Fts3Phrase *pFVar5;
  Fts3Table *pTab;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  char *__dest;
  sqlite3_int64 sVar10;
  u8 uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  TokenDoclist *p;
  Fts3Expr *pFVar17;
  char **ppcVar18;
  long in_FS_OFFSET;
  bool bVar19;
  u8 uVar20;
  char *pR;
  char *pL;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  int iStack_c0;
  u8 local_b9;
  TokenDoclist local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*pRc != 0) || (pExpr->bEof != '\0')) goto LAB_001cc860;
  pbEof = &pExpr->bEof;
  uVar2 = pCsr->bDesc;
  pExpr->bStart = '\x01';
  switch(pExpr->eType) {
  case 1:
  case 3:
    pFVar3 = pExpr->pLeft;
    pFVar4 = pExpr->pRight;
    if (pFVar3->bDeferred == '\0') {
      uVar20 = pFVar4->bDeferred;
      fts3EvalNextRow(pCsr,pFVar3,pRc);
      if (uVar20 == '\0') {
        fts3EvalNextRow(pCsr,pFVar4,pRc);
        uVar20 = pFVar3->bEof;
        while (uVar20 == '\0') {
          uVar20 = pFVar4->bEof;
          if (uVar20 != '\0') {
            lVar9 = pFVar3->iDocid;
LAB_001ccfac:
            pExpr->iDocid = lVar9;
            bVar19 = uVar20 != '\0';
            goto LAB_001ccfba;
          }
          lVar9 = pFVar3->iDocid;
          if (*pRc != 0) goto LAB_001ccfac;
          iVar6 = -(uint)(lVar9 != pFVar4->iDocid);
          if (pFVar4->iDocid < lVar9) {
            iVar6 = 1;
          }
          iVar12 = -iVar6;
          if (uVar2 == '\0') {
            iVar12 = iVar6;
          }
          if (iVar12 == 0) goto LAB_001ccfac;
          pFVar17 = pFVar3;
          if (-1 < iVar12) {
            pFVar17 = pFVar4;
          }
          fts3EvalNextRow(pCsr,pFVar17,pRc);
          uVar20 = pFVar3->bEof;
        }
        pExpr->iDocid = pFVar3->iDocid;
        bVar19 = true;
LAB_001ccfba:
        pExpr->bEof = bVar19;
        if ((pExpr->eType == 1) && (bVar19 != false)) {
          pFVar5 = pFVar4->pPhrase;
          if ((pFVar5->doclist).aAll != (char *)0x0) {
            iVar6 = *pRc;
            while ((iVar6 == 0 && (pFVar4->bEof == '\0'))) {
              memset((pFVar5->doclist).pList,0,(long)(pFVar5->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar4,pRc);
              iVar6 = *pRc;
            }
          }
          pFVar5 = pFVar3->pPhrase;
          if ((pFVar5 != (Fts3Phrase *)0x0) && ((pFVar5->doclist).aAll != (char *)0x0)) {
            iVar6 = *pRc;
            while ((iVar6 == 0 && (pFVar3->bEof == '\0'))) {
              memset((pFVar5->doclist).pList,0,(long)(pFVar5->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar3,pRc);
              iVar6 = *pRc;
            }
          }
          pFVar3->bEof = '\x01';
          pFVar4->bEof = '\x01';
        }
      }
      else {
        pExpr->iDocid = pFVar3->iDocid;
        pExpr->bEof = pFVar3->bEof;
      }
    }
    else {
      fts3EvalNextRow(pCsr,pFVar4,pRc);
      pExpr->iDocid = pFVar4->iDocid;
      pExpr->bEof = pFVar4->bEof;
    }
    break;
  case 2:
    pFVar3 = pExpr->pLeft;
    pFVar4 = pExpr->pRight;
    if (pFVar4->bStart == '\0') {
      fts3EvalNextRow(pCsr,pFVar4,pRc);
    }
    fts3EvalNextRow(pCsr,pFVar3,pRc);
    uVar20 = pFVar3->bEof;
    if (uVar20 == '\0') {
      if (*pRc == 0) {
        while (pFVar4->bEof == '\0') {
          bVar19 = pFVar3->iDocid < pFVar4->iDocid;
          if (uVar2 == '\0') {
            bVar19 = pFVar4->iDocid < pFVar3->iDocid;
          }
          if ((!bVar19) || (fts3EvalNextRow(pCsr,pFVar4,pRc), *pRc != 0)) break;
        }
        uVar20 = pFVar3->bEof;
      }
      else {
        uVar20 = '\0';
      }
    }
    pExpr->iDocid = pFVar3->iDocid;
    pExpr->bEof = uVar20;
    break;
  case 4:
    pFVar3 = pExpr->pLeft;
    pFVar4 = pExpr->pRight;
    iVar6 = 1;
    if (pFVar3->iDocid <= pFVar4->iDocid) {
      iVar6 = -(uint)(pFVar3->iDocid != pFVar4->iDocid);
    }
    uVar7 = -(uint)(uVar2 != '\0') | 1;
    pFVar17 = pFVar3;
    if (pFVar4->bEof == '\0') {
      iVar6 = iVar6 * uVar7;
      if ((((pFVar3->bEof != '\0') || (-1 < iVar6)) && (pFVar17 = pFVar4, pFVar3->bEof == '\0')) &&
         (iVar6 < 1)) {
        fts3EvalNextRow(pCsr,pFVar3,pRc);
      }
    }
    fts3EvalNextRow(pCsr,pFVar17,pRc);
    if (pFVar3->bEof == '\0') {
      bVar19 = false;
    }
    else {
      bVar19 = pFVar4->bEof != '\0';
    }
    *pbEof = bVar19;
    sVar10 = pFVar3->iDocid;
    if (pFVar4->bEof == '\0') {
      lVar9 = pFVar4->iDocid;
      iVar6 = 1;
      if (sVar10 <= lVar9) {
        iVar6 = -(uint)(sVar10 != lVar9);
      }
      if ((pFVar3->bEof != '\0') || (-1 < (int)(iVar6 * uVar7))) {
        pExpr->iDocid = lVar9;
        break;
      }
    }
    goto LAB_001ccf9c;
  default:
    pFVar5 = pExpr->pPhrase;
    if ((pFVar5->doclist).bFreeList != 0) {
      sqlite3_free((pFVar5->doclist).pList);
    }
    (pFVar5->doclist).pList = (char *)0x0;
    pnList = &(pFVar5->doclist).nList;
    (pFVar5->doclist).nList = 0;
    (pFVar5->doclist).bFreeList = 0;
    pTab = (Fts3Table *)(pCsr->base).pVtab;
    if (pFVar5->bIncr != 0) {
      local_b9 = '\0';
      if (pFVar5->nToken != 1) {
        uVar2 = pCsr->bDesc;
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_98 = 0;
        uStack_90 = 0;
        local_b8.pList = (char *)0x0;
        local_b8.nList = 0;
        local_b8._28_4_ = 0;
        local_b8.bIgnore = 0;
        local_b8._4_4_ = 0;
        local_b8.iDocid = 0;
        uVar20 = '\0';
        uVar7 = -(uint)(uVar2 != '\0') | 1;
        iVar6 = 0;
        do {
          if (iVar6 == 0) {
            p = &local_b8;
            lVar14 = 0;
            bVar19 = false;
            lVar9 = 0;
            do {
              iVar6 = 0;
              uVar20 = local_b9;
              if ((pFVar5->nToken <= lVar14) || (local_b9 != '\0')) break;
              iVar6 = incrPhraseTokenNext(pTab,pFVar5,(int)lVar14,p,&local_b9);
              if (p->bIgnore == 0) {
                lVar13 = p->iDocid;
                if (bVar19) {
                  iVar12 = -(uint)(lVar9 != lVar13);
                  if (lVar13 < lVar9) {
                    iVar12 = 1;
                  }
                  iVar16 = -iVar12;
                  if (uVar2 == '\0') {
                    iVar16 = iVar12;
                  }
                  if (-1 < iVar16) {
                    lVar13 = lVar9;
                  }
                }
                bVar19 = true;
                lVar9 = lVar13;
              }
              lVar14 = lVar14 + 1;
              p = p + 1;
              uVar20 = local_b9;
            } while (iVar6 == 0);
          }
          else {
            lVar9 = 0;
          }
          iVar12 = pFVar5->nToken;
          if (0 < iVar12) {
            iVar16 = 0;
            uVar11 = uVar20;
            do {
              if ((iVar6 == 0) && (uVar11 == '\0')) {
                lVar14 = (long)iVar16;
                uVar11 = '\0';
                if ((&local_b8)[lVar14].bIgnore == 0) {
                  iVar15 = -(uint)((&local_b8)[lVar14].iDocid != lVar9);
                  if (lVar9 < (&local_b8)[lVar14].iDocid) {
                    iVar15 = 1;
                  }
                  uVar11 = '\0';
                  iVar6 = 0;
                  lVar13 = lVar9;
                  iVar8 = iVar16;
                  if ((int)(iVar15 * uVar7) < 0) {
                    do {
                      iVar6 = incrPhraseTokenNext(pTab,pFVar5,iVar8,&local_b8 + lVar14,&local_b9);
                      lVar9 = (&local_b8)[lVar14].iDocid;
                      iVar12 = 1;
                      if (lVar9 <= lVar13) {
                        iVar12 = -(uint)(lVar9 != lVar13);
                      }
                      iVar16 = 0;
                      if ((int)(iVar12 * uVar7) < 1) {
                        lVar9 = lVar13;
                        iVar16 = iVar8;
                      }
                      uVar11 = local_b9;
                      if ((iVar6 != 0) || (local_b9 != '\0')) goto LAB_001ccd19;
                      lVar14 = (long)iVar16;
                      if ((&local_b8)[lVar14].bIgnore != 0) break;
                      iVar12 = 1;
                      if ((&local_b8)[lVar14].iDocid <= lVar9) {
                        iVar12 = -(uint)((&local_b8)[lVar14].iDocid != lVar9);
                      }
                      lVar13 = lVar9;
                      iVar8 = iVar16;
                    } while ((int)(iVar12 * uVar7) < 0);
                    uVar11 = '\0';
LAB_001ccd19:
                    iVar12 = pFVar5->nToken;
                    uVar20 = uVar11;
                  }
                }
                else {
                  iVar6 = 0;
                }
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 < iVar12);
          }
          if (uVar20 != '\0') goto LAB_001ccf89;
          iVar12 = (&iStack_c0)[(long)iVar12 * 8];
          iVar16 = sqlite3_initialize();
          if ((iVar16 != 0) ||
             (__dest = (char *)sqlite3Malloc((long)iVar12 + 8), __dest == (char *)0x0)) {
            iVar6 = 7;
            goto LAB_001ccf96;
          }
          memcpy(__dest,(&local_c8)[(long)pFVar5->nToken * 4],(long)(iVar12 + 1));
          pcVar1 = __dest + iVar12;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = '\0';
          pcVar1[3] = '\0';
          pcVar1[4] = '\0';
          pcVar1[5] = '\0';
          pcVar1[6] = '\0';
          pcVar1[7] = '\0';
          iVar12 = pFVar5->nToken;
          lVar14 = 0;
          if (iVar12 < 2) {
            iVar16 = 0;
          }
          else {
            lVar14 = 0;
            iVar15 = -1;
            ppcVar18 = &local_b8.pList;
            iVar16 = 0;
            do {
              if (((TokenDoclist *)(ppcVar18 + -2))->bIgnore == 0) {
                local_c8 = *ppcVar18;
                local_d8 = __dest;
                local_d0 = __dest;
                iVar8 = fts3PoslistPhraseMerge(&local_d8,iVar12 + iVar15,0,1,&local_c8,&local_d0);
                iVar12 = pFVar5->nToken;
                if (iVar8 == 0) break;
                iVar16 = (int)local_d8 - (int)__dest;
              }
              lVar14 = lVar14 + 1;
              iVar15 = iVar15 + -1;
              ppcVar18 = ppcVar18 + 4;
            } while (lVar14 < iVar12 + -1);
          }
          if ((int)lVar14 == iVar12 + -1) goto LAB_001ccf69;
          sqlite3_free(__dest);
        } while( true );
      }
      iVar6 = sqlite3Fts3MsrIncrNext
                        (pTab,pFVar5->aToken[0].pSegcsr,&(pFVar5->doclist).iDocid,
                         &(pFVar5->doclist).pList,pnList);
      uVar20 = (pFVar5->doclist).pList == (char *)0x0;
      goto LAB_001ccf89;
    }
    if ((pCsr->bDesc == pTab->bDescIdx) || (iVar6 = (pFVar5->doclist).nAll, iVar6 == 0)) {
      fts3EvalDlPhraseNext(pTab,&pFVar5->doclist,pbEof);
    }
    else {
      sqlite3Fts3DoclistPrev
                ((uint)pTab->bDescIdx,(pFVar5->doclist).aAll,iVar6,&(pFVar5->doclist).pNextDocid,
                 &(pFVar5->doclist).iDocid,pnList,pbEof);
      (pFVar5->doclist).pList = (pFVar5->doclist).pNextDocid;
    }
    iVar6 = 0;
    goto LAB_001ccf96;
  }
LAB_001cc860:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
LAB_001ccf69:
  (pFVar5->doclist).iDocid = lVar9;
  (pFVar5->doclist).pList = __dest;
  (pFVar5->doclist).nList = iVar16;
  (pFVar5->doclist).bFreeList = 1;
  uVar20 = '\0';
LAB_001ccf89:
  *pbEof = uVar20;
LAB_001ccf96:
  *pRc = iVar6;
  sVar10 = (pFVar5->doclist).iDocid;
LAB_001ccf9c:
  pExpr->iDocid = sVar10;
  goto LAB_001cc860;
}

Assistant:

static void fts3EvalNextRow(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expr. to advance to next matching row */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK && pExpr->bEof==0 ){
    int bDescDoclist = pCsr->bDesc;         /* Used by DOCID_CMP() macro */
    pExpr->bStart = 1;

    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        assert( !pLeft->bDeferred || !pRight->bDeferred );

        if( pLeft->bDeferred ){
          /* LHS is entirely deferred. So we assume it matches every row.
          ** Advance the RHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pRight, pRc);
          pExpr->iDocid = pRight->iDocid;
          pExpr->bEof = pRight->bEof;
        }else if( pRight->bDeferred ){
          /* RHS is entirely deferred. So we assume it matches every row.
          ** Advance the LHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = pLeft->bEof;
        }else{
          /* Neither the RHS or LHS are deferred. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
          while( !pLeft->bEof && !pRight->bEof && *pRc==SQLITE_OK ){
            sqlite3_int64 iDiff = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
            if( iDiff==0 ) break;
            if( iDiff<0 ){
              fts3EvalNextRow(pCsr, pLeft, pRc);
            }else{
              fts3EvalNextRow(pCsr, pRight, pRc);
            }
          }
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = (pLeft->bEof || pRight->bEof);
          if( pExpr->eType==FTSQUERY_NEAR && pExpr->bEof ){
            assert( pRight->eType==FTSQUERY_PHRASE );
            if( pRight->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pRight->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pRight->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pRight, pRc);
              }
            }
            if( pLeft->pPhrase && pLeft->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pLeft->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pLeft->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pLeft, pRc);
              }
            }
            pRight->bEof = pLeft->bEof = 1;
          }
        }
        break;
      }

      case FTSQUERY_OR: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        sqlite3_int64 iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);

        assert_fts3_nc( pLeft->bStart || pLeft->iDocid==pRight->iDocid );
        assert_fts3_nc( pRight->bStart || pLeft->iDocid==pRight->iDocid );

        if( pRight->bEof || (pLeft->bEof==0 && iCmp<0) ){
          fts3EvalNextRow(pCsr, pLeft, pRc);
        }else if( pLeft->bEof || iCmp>0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
        }else{
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
        }

        pExpr->bEof = (pLeft->bEof && pRight->bEof);
        iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
        if( pRight->bEof || (pLeft->bEof==0 &&  iCmp<0) ){
          pExpr->iDocid = pLeft->iDocid;
        }else{
          pExpr->iDocid = pRight->iDocid;
        }

        break;
      }

      case FTSQUERY_NOT: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;

        if( pRight->bStart==0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
          assert( *pRc!=SQLITE_OK || pRight->bStart );
        }

        fts3EvalNextRow(pCsr, pLeft, pRc);
        if( pLeft->bEof==0 ){
          while( !*pRc
              && !pRight->bEof
              && DOCID_CMP(pLeft->iDocid, pRight->iDocid)>0
          ){
            fts3EvalNextRow(pCsr, pRight, pRc);
          }
        }
        pExpr->iDocid = pLeft->iDocid;
        pExpr->bEof = pLeft->bEof;
        break;
      }

      default: {
        Fts3Phrase *pPhrase = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pPhrase);
        *pRc = fts3EvalPhraseNext(pCsr, pPhrase, &pExpr->bEof);
        pExpr->iDocid = pPhrase->doclist.iDocid;
        break;
      }
    }
  }
}